

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radixsort.inl
# Opt level: O3

uint32_t __thiscall
bits::detail::
RadixSort<11U,_unsigned_int,_unsigned_int,_bits::detail::FloatFlip,_bits::detail::InvFloatFlip>::
operator()(RadixSort<11U,_unsigned_int,_unsigned_int,_bits::detail::FloatFlip,_bits::detail::InvFloatFlip>
           *this,uint *keys_in,uint *keys_temp,uint *values_in,uint *values_temp,uint32_t size)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  uint *puVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint *puVar8;
  long lVar9;
  uint32_t sum [3];
  uint32_t hist [3] [2048];
  uint local_6044 [4];
  uint local_6034 [2047];
  uint auStack_4038 [2048];
  uint auStack_2038 [2050];
  
  uVar2 = (ulong)size;
  memset(local_6044 + 3,0,0x6000);
  if (size != 0) {
    uVar5 = 0;
    do {
      uVar1 = keys_in[uVar5];
      lVar3 = 0;
      puVar4 = local_6044 + 3;
      do {
        puVar4[(((int)uVar1 >> 0x1f | 0x80000000U) ^ uVar1) >> ((byte)lVar3 & 0x1f) & 0x7ff] =
             puVar4[(((int)uVar1 >> 0x1f | 0x80000000U) ^ uVar1) >> ((byte)lVar3 & 0x1f) & 0x7ff] +
             1;
        lVar3 = lVar3 + 0xb;
        puVar4 = puVar4 + 0x800;
      } while (lVar3 != 0x21);
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar2);
  }
  puVar4 = local_6044 + 3;
  lVar3 = 0;
  do {
    local_6044[lVar3] = *puVar4;
    *puVar4 = 0;
    lVar3 = lVar3 + 1;
    puVar4 = puVar4 + 0x800;
  } while (lVar3 != 3);
  lVar3 = 1;
  puVar4 = local_6044 + 4;
  do {
    lVar9 = 0;
    puVar8 = puVar4;
    do {
      uVar1 = local_6044[lVar9];
      uVar7 = *puVar8;
      *puVar8 = uVar1;
      local_6044[lVar9] = uVar7 + uVar1;
      lVar9 = lVar9 + 1;
      puVar8 = puVar8 + 0x800;
    } while (lVar9 != 3);
    lVar3 = lVar3 + 1;
    puVar4 = puVar4 + 1;
  } while (lVar3 != 0x800);
  if (size != 0) {
    uVar5 = 0;
    do {
      uVar7 = ((int)keys_in[uVar5] >> 0x1f | 0x80000000U) ^ keys_in[uVar5];
      uVar6 = (ulong)(uVar7 & 0x7ff);
      uVar1 = local_6044[uVar6 + 3];
      local_6044[uVar6 + 3] = uVar1 + 1;
      keys_temp[uVar1] = uVar7;
      values_temp[uVar1] = values_in[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
    uVar5 = 0;
    do {
      uVar1 = keys_temp[uVar5];
      uVar6 = (ulong)(uVar1 >> 9 & 0x1ffc);
      uVar7 = *(uint *)((long)auStack_4038 + uVar6);
      *(uint *)((long)auStack_4038 + uVar6) = uVar7 + 1;
      keys_in[uVar7] = uVar1;
      values_in[uVar7] = values_temp[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
    uVar5 = 0;
    do {
      uVar1 = keys_in[uVar5];
      uVar7 = auStack_2038[uVar1 >> 0x16];
      auStack_2038[uVar1 >> 0x16] = uVar7 + 1;
      keys_temp[uVar7] = (0xffffffffU - ((int)uVar1 >> 0x1f) | 0x80000000) ^ uVar1;
      values_temp[uVar7] = values_in[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
  }
  return 1;
}

Assistant:

uint32_t operator()(KeyType* __restrict keys_in,
        KeyType* __restrict keys_temp, ValueType* __restrict values_in,
        ValueType* __restrict values_temp, uint32_t size) const
    {
        DecodeOp decode_op;
        EncodeOp encode_op;
        PassThrough pass_through;

        // Initialise each histogram bucket with the key value
        uint32_t hist[kHistBuckets][kHistSize] = {0};
        for (uint32_t i = 0; i < size; ++i)
        {
            const KeyType key = decode_op(keys_in[i]);
            for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
            {
                const uint32_t shift = bucket * kRadixBits;
                const uint32_t pos = (key >> shift) & kHistMask;
                ++hist[bucket][pos];
            }
        }

        // Update the histogram data so each entry sums the previous entries
        uint32_t sum[kHistBuckets];
        for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
        {
            sum[bucket] = hist[bucket][0];
            hist[bucket][0] = 0;
        }

        uint32_t tsum;
        for (uint32_t i = 1; i < kHistSize; ++i)
        {
            for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
            {
                tsum = hist[bucket][i] + sum[bucket];
                hist[bucket][i] = sum[bucket];
                sum[bucket] = tsum;
            }
        }

        // alternate input and output buffers on each radix pass
        KeyType* __restrict keys[2] = {keys_in, keys_temp};
        ValueType* __restrict values[2] = {values_in, values_temp};

        uint32_t out = 0;

        {
            // decode key on first radix pass
            const uint32_t bucket = 0;
            const uint32_t in = bucket & 1;
            out = !in;
            radix_pass(keys[in], keys[out], values[in], values[out], size, hist[bucket],
                bucket * kRadixBits, decode_op, pass_through);
        }

        for (uint32_t bucket = 1; bucket < kHistBuckets - 1; ++bucket)
        {
            const uint32_t in = bucket & 1;
            out = !in;
            radix_pass(keys[in], keys[out], values[in], values[out], size, hist[bucket],
                bucket * kRadixBits, pass_through, pass_through);
        }

        {
            // encode key on last radix pass
            const uint32_t bucket = kHistBuckets - 1;
            const uint32_t in = bucket & 1;
            out = !in;
            radix_pass(keys[in], keys[out], values[in], values[out], size, hist[bucket],
                bucket * kRadixBits, pass_through, encode_op);
        }

        return out;
    }